

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

uint32_t * bcm2835_regbase(uint8_t regbase)

{
  uint32_t *puStack_10;
  uint8_t regbase_local;
  
  switch(regbase) {
  case '\x01':
    puStack_10 = bcm2835_st;
    break;
  case '\x02':
    puStack_10 = bcm2835_gpio;
    break;
  case '\x03':
    puStack_10 = bcm2835_pwm;
    break;
  case '\x04':
    puStack_10 = bcm2835_clk;
    break;
  case '\x05':
    puStack_10 = bcm2835_pads;
    break;
  case '\x06':
    puStack_10 = bcm2835_spi0;
    break;
  case '\a':
    puStack_10 = bcm2835_bsc0;
    break;
  case '\b':
    puStack_10 = bcm2835_st;
    break;
  case '\t':
    puStack_10 = bcm2835_aux;
    break;
  case '\n':
    puStack_10 = bcm2835_spi1;
    break;
  default:
    puStack_10 = (uint32_t *)0xffffffffffffffff;
  }
  return puStack_10;
}

Assistant:

uint32_t* bcm2835_regbase(uint8_t regbase)
{
    switch (regbase)
    {
	case BCM2835_REGBASE_ST:
	    return (uint32_t *)bcm2835_st;
	case BCM2835_REGBASE_GPIO:
	    return (uint32_t *)bcm2835_gpio;
	case BCM2835_REGBASE_PWM:
	    return (uint32_t *)bcm2835_pwm;
	case BCM2835_REGBASE_CLK:
	    return (uint32_t *)bcm2835_clk;
	case BCM2835_REGBASE_PADS:
	    return (uint32_t *)bcm2835_pads;
	case BCM2835_REGBASE_SPI0:
	    return (uint32_t *)bcm2835_spi0;
	case BCM2835_REGBASE_BSC0:
	    return (uint32_t *)bcm2835_bsc0;
	case BCM2835_REGBASE_BSC1:
	    return (uint32_t *)bcm2835_st;
	case BCM2835_REGBASE_AUX:
	    return (uint32_t *)bcm2835_aux;
	case BCM2835_REGBASE_SPI1:
	    return (uint32_t *)bcm2835_spi1;

    }
    return (uint32_t *)MAP_FAILED;
}